

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

value * __thiscall docopt::value::operator=(value *this,value *other)

{
  value *this_00;
  value *in_RDI;
  value *in_stack_ffffffffffffffc0;
  value *in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  
  value(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = operator=(in_stack_ffffffffffffffc0,in_RDI);
  ~value(this_00);
  return this_00;
}

Assistant:

inline
	value& value::operator=(value const& other) {
		// make a copy and move from it; way easier.
		return *this = value{other};
	}